

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_>::dispose
          (ArrayBuilder<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_> *this)

{
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *firstElement;
  RemoveConst<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_> *pRVar1;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *pOVar2;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *endCopy;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *posCopy;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *ptrCopy;
  ArrayBuilder<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pOVar2 = this->endPtr;
  if (firstElement != (Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *)0x0) {
    this->ptr = (Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *)0x0;
    this->pos = (RemoveConst<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>_> *)0x0;
    this->endPtr = (Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *)0x0;
    ArrayDisposer::dispose<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 4,
               (long)pOVar2 - (long)firstElement >> 4);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }